

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O1

void lysp_type_enum_free(lysf_ctx *ctx,lysp_type_enum *item)

{
  lysp_qname *plVar1;
  lysp_ext_instance *plVar2;
  ulong uVar3;
  lysp_ext_instance *plVar4;
  uint64_t c__;
  ulong uVar5;
  lysp_ext_instance *plVar6;
  long lVar7;
  
  lydict_remove(ctx->ctx,item->name);
  lydict_remove(ctx->ctx,item->dsc);
  lydict_remove(ctx->ctx,item->ref);
  lVar7 = 0;
  uVar5 = 0;
  while( true ) {
    plVar1 = item->iffeatures;
    if (plVar1 == (lysp_qname *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)&plVar1[-1].flags;
    }
    if (uVar3 <= uVar5) break;
    if (plVar1 != (lysp_qname *)0x0) {
      lydict_remove(ctx->ctx,*(char **)((long)&plVar1->str + lVar7));
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 0x18;
  }
  if (plVar1 != (lysp_qname *)0x0) {
    free(&plVar1[-1].flags);
  }
  lVar7 = 0;
  plVar6 = (lysp_ext_instance *)0x0;
  while( true ) {
    plVar2 = item->exts;
    if (plVar2 == (lysp_ext_instance *)0x0) {
      plVar4 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar4 = plVar2[-1].exts;
    }
    if (plVar4 <= plVar6) break;
    lysp_ext_instance_free(ctx,(lysp_ext_instance *)((long)&plVar2->name + lVar7));
    plVar6 = (lysp_ext_instance *)((long)&plVar6->name + 1);
    lVar7 = lVar7 + 0x70;
  }
  if (plVar2 != (lysp_ext_instance *)0x0) {
    free(&plVar2[-1].exts);
    return;
  }
  return;
}

Assistant:

static void
lysp_type_enum_free(struct lysf_ctx *ctx, struct lysp_type_enum *item)
{
    lydict_remove(ctx->ctx, item->name);
    lydict_remove(ctx->ctx, item->dsc);
    lydict_remove(ctx->ctx, item->ref);
    FREE_ARRAY(ctx->ctx, item->iffeatures, lysp_qname_free);
    FREE_ARRAY(ctx, item->exts, lysp_ext_instance_free);
}